

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O1

QTextDocumentFragment __thiscall
QTextDocumentFragment::fromPlainText(QTextDocumentFragment *this,QString *plainText)

{
  undefined1 *puVar1;
  QTextDocumentFragmentPrivate *this_00;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QTextCursor local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTextDocumentFragment(this);
  this_00 = (QTextDocumentFragmentPrivate *)operator_new(0x18);
  QTextCursor::QTextCursor(&local_38);
  QTextDocumentFragmentPrivate::QTextDocumentFragmentPrivate(this_00,&local_38);
  this->d = this_00;
  QTextCursor::~QTextCursor(&local_38);
  puVar1 = &this->d->field_0x10;
  *puVar1 = *puVar1 | 1;
  local_38.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor(&local_38,this->d->doc);
  QTextCursor::insertText(&local_38,plainText);
  QTextCursor::~QTextCursor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QTextDocumentFragment)(QTextDocumentFragmentPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocumentFragment QTextDocumentFragment::fromPlainText(const QString &plainText)
{
    QTextDocumentFragment res;

    res.d = new QTextDocumentFragmentPrivate;
    res.d->importedFromPlainText = true;
    QTextCursor cursor(res.d->doc);
    cursor.insertText(plainText);
    return res;
}